

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_raw.c
# Opt level: O0

int archive_read_format_raw_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  undefined8 *in_RCX;
  size_t *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  ssize_t avail;
  raw_info *info;
  archive_vtable_conflict *in_stack_ffffffffffffffc8;
  archive_read *a_00;
  int local_4;
  
  a_00 = (archive_read *)**(undefined8 **)(in_RDI + 0x948);
  if ((a_00->archive).vtable != (archive_vtable_conflict *)0x0) {
    __archive_read_consume(a_00,(int64_t)in_stack_ffffffffffffffc8);
    (a_00->archive).vtable = (archive_vtable_conflict *)0x0;
  }
  if ((a_00->archive).archive_format == 0) {
    pvVar1 = __archive_read_ahead(a_00,(size_t)in_stack_ffffffffffffffc8,(ssize_t *)0x14d6d2);
    *in_RSI = pvVar1;
    if ((long)in_stack_ffffffffffffffc8 < 1) {
      if (in_stack_ffffffffffffffc8 == (archive_vtable_conflict *)0x0) {
        (a_00->archive).archive_format = 1;
        *in_RDX = 0;
        *in_RCX = *(undefined8 *)&a_00->archive;
        local_4 = 1;
      }
      else {
        *in_RDX = 0;
        *in_RCX = *(undefined8 *)&a_00->archive;
        local_4 = (int)in_stack_ffffffffffffffc8;
      }
    }
    else {
      *in_RDX = (size_t)in_stack_ffffffffffffffc8;
      *in_RCX = *(undefined8 *)&a_00->archive;
      *(size_t *)&a_00->archive = *in_RDX + *(long *)&a_00->archive;
      (a_00->archive).vtable = in_stack_ffffffffffffffc8;
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_raw_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct raw_info *info;
	ssize_t avail;

	info = (struct raw_info *)(a->format->data);

	/* Consume the bytes we read last time. */
	if (info->unconsumed) {
		__archive_read_consume(a, info->unconsumed);
		info->unconsumed = 0;
	}

	if (info->end_of_file)
		return (ARCHIVE_EOF);

	/* Get whatever bytes are immediately available. */
	*buff = __archive_read_ahead(a, 1, &avail);
	if (avail > 0) {
		/* Return the bytes we just read */
		*size = avail;
		*offset = info->offset;
		info->offset += *size;
		info->unconsumed = avail;
		return (ARCHIVE_OK);
	} else if (0 == avail) {
		/* Record and return end-of-file. */
		info->end_of_file = 1;
		*size = 0;
		*offset = info->offset;
		return (ARCHIVE_EOF);
	} else {
		/* Record and return an error. */
		*size = 0;
		*offset = info->offset;
		return ((int)avail);
	}
}